

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

void Abc_NtkPrintLatch(FILE *pFile,Abc_Ntk_t *pNtk)

{
  int *piVar1;
  long *plVar2;
  long *plVar3;
  Abc_Obj_t *pNode;
  int iVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  int iVar8;
  undefined8 *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int InitNums [4];
  ulong local_38;
  ulong uStack_30;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcPrint.c"
                  ,0x203,"void Abc_NtkPrintLatch(FILE *, Abc_Ntk_t *)");
  }
  uVar5 = pNtk->nObjCounts[8];
  if (uVar5 == 0) {
    fwrite("The network is combinational.\n",0x1e,1,(FILE *)pFile);
    return;
  }
  local_38 = 0;
  uStack_30 = 0;
  pVVar6 = pNtk->vBoxes;
  if (pVVar6->nSize < 1) {
    uVar11 = 0;
    uVar10 = 0;
    uVar7 = 0;
    iVar8 = 0;
  }
  else {
    lVar12 = 0;
    iVar8 = 0;
    do {
      plVar2 = (long *)pVVar6->pArray[lVar12];
      uVar5 = *(uint *)((long)plVar2 + 0x14);
      if ((uVar5 & 0xf) == 8) {
        if (3 < (int)plVar2[7]) {
          __assert_fail("Init < 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcPrint.c"
                        ,0x210,"void Abc_NtkPrintLatch(FILE *, Abc_Ntk_t *)");
        }
        piVar1 = (int *)((long)&local_38 + (long)(int)plVar2[7] * 4);
        *piVar1 = *piVar1 + 1;
        plVar3 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        pNode = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          puVar9 = (undefined8 *)((ulong)pNode & 0xfffffffffffffffe);
          if (*(int *)*puVar9 != 3) {
            __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                          ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
          }
          if ((*(uint *)((long)puVar9 + 0x14) & 0xf) == 1) goto LAB_0028bb62;
        }
        else {
          if (pNtk->ntkType != ABC_NTK_LOGIC) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcPrint.c"
                          ,0x21f,"void Abc_NtkPrintLatch(FILE *, Abc_Ntk_t *)");
          }
          iVar4 = Abc_NodeIsConst(pNode);
          if (iVar4 != 0) {
            uVar5 = *(uint *)((long)plVar2 + 0x14);
LAB_0028bb62:
            if ((uVar5 & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                            ,0x1aa,"int Abc_LatchIsInitDc(Abc_Obj_t *)");
            }
            iVar8 = iVar8 + 1;
            if ((plVar2[7] != 3) && (pNtk->ntkType != ABC_NTK_STRASH)) {
              plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                 (long)*(int *)plVar2[4] * 8);
              Abc_NodeIsConst1(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                (long)*(int *)plVar2[4] * 8));
            }
          }
        }
      }
      lVar12 = lVar12 + 1;
      pVVar6 = pNtk->vBoxes;
    } while (lVar12 < pVVar6->nSize);
    uVar5 = pNtk->nObjCounts[8];
    uVar7 = local_38 >> 0x20;
    uVar10 = uStack_30 & 0xffffffff;
    uVar11 = uStack_30 >> 0x20;
  }
  fprintf((FILE *)pFile,
          "Total latches = %5d. Init0 = %d. Init1 = %d. InitDC = %d. Const data = %d.\n",
          (ulong)uVar5,uVar7,uVar10,uVar11,iVar8);
  return;
}

Assistant:

void Abc_NtkPrintLatch( FILE * pFile, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pLatch, * pFanin;
    int i, Counter0, Counter1, Counter2;
    int InitNums[4], Init;

    assert( !Abc_NtkIsNetlist(pNtk) );
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        fprintf( pFile, "The network is combinational.\n" );
        return;
    }

    for ( i = 0; i < 4; i++ )
        InitNums[i] = 0;
    Counter0 = Counter1 = Counter2 = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        Init = Abc_LatchInit( pLatch );
        assert( Init < 4 );
        InitNums[Init]++;

        pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pLatch));
        if ( Abc_NtkIsLogic(pNtk) )
        {
            if ( !Abc_NodeIsConst(pFanin) )
                continue;
        }
        else if ( Abc_NtkIsStrash(pNtk) )
        {
            if ( !Abc_AigNodeIsConst(pFanin) )
                continue;
        }
        else
            assert( 0 );

        // the latch input is a constant node
        Counter0++;
        if ( Abc_LatchIsInitDc(pLatch) )
        {
            Counter1++;
            continue;
        }
        // count the number of cases when the constant is equal to the initial value
        if ( Abc_NtkIsStrash(pNtk) )
        {
            if ( Abc_LatchIsInit1(pLatch) == !Abc_ObjFaninC0(pLatch) )
                Counter2++;
        }
        else
        {
            if ( Abc_LatchIsInit1(pLatch) == Abc_NodeIsConst1(Abc_ObjFanin0(Abc_ObjFanin0(pLatch))) )
                Counter2++;
        }
    }
//    fprintf( pFile, "%-15s:  ", pNtk->pName );
    fprintf( pFile, "Total latches = %5d. Init0 = %d. Init1 = %d. InitDC = %d. Const data = %d.\n",
        Abc_NtkLatchNum(pNtk), InitNums[1], InitNums[2], InitNums[3], Counter0 );
//    fprintf( pFile, "Const fanin = %3d. DC init = %3d. Matching init = %3d. ", Counter0, Counter1, Counter2 );
//    fprintf( pFile, "Self-feed latches = %2d.\n", -1 ); //Abc_NtkCountSelfFeedLatches(pNtk) );
}